

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_manual_hostkey.c
# Opt level: O0

_Bool validate_manual_hostkey(char *key)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char *pcVar7;
  _Bool _Var8;
  int iVar9;
  int iVar10;
  uint32_t uVar11;
  size_t sVar12;
  char *pcVar13;
  char *__s;
  size_t base64_len;
  int len;
  int minlen;
  uint alglen;
  undefined1 auStack_3c [2];
  uchar decoded [6];
  int i;
  char *s;
  char *r;
  char *q;
  char *p;
  char *key_local;
  
  q = key;
  do {
    sVar12 = strspn(q," \t");
    __s = q + sVar12;
    if (q[sVar12] == '\0') {
      return false;
    }
    sVar12 = strcspn(__s," \t");
    pcVar13 = __s + sVar12;
    q = pcVar13;
    if (*pcVar13 != '\0') {
      q = pcVar13 + 1;
      *pcVar13 = '\0';
    }
    _Var8 = strstartswith(__s,"SHA256:");
    if ((_Var8) &&
       (sVar12 = strspn(__s + 7,"0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ+/"),
       sVar12 == 0x2b)) {
      uVar1 = *(undefined8 *)__s;
      uVar2 = *(undefined8 *)(__s + 8);
      uVar3 = *(undefined8 *)(__s + 0x10);
      uVar4 = *(undefined8 *)(__s + 0x18);
      uVar5 = *(undefined8 *)(__s + 0x20);
      uVar6 = *(undefined8 *)(__s + 0x28);
      *(undefined2 *)(key + 0x30) = *(undefined2 *)(__s + 0x30);
      *(undefined8 *)(key + 0x20) = uVar5;
      *(undefined8 *)(key + 0x28) = uVar6;
      *(undefined8 *)(key + 0x10) = uVar3;
      *(undefined8 *)(key + 0x18) = uVar4;
      *(undefined8 *)key = uVar1;
      *(undefined8 *)(key + 8) = uVar2;
      key[0x32] = '\0';
      return true;
    }
    _Var8 = strstartswith(__s,"MD5:");
    s = __s;
    if (_Var8) {
      s = __s + 4;
    }
    sVar12 = strlen(s);
    pcVar13 = __s;
    pcVar7 = __s;
    if ((sVar12 == 0x2f) && (sVar12 = strspn(s,"0123456789abcdefABCDEF:"), s[sVar12] == '\0')) {
      for (_auStack_3c = 0; _auStack_3c < 0x10; _auStack_3c = _auStack_3c + 1) {
        if ((s[_auStack_3c * 3] == ':') || (s[_auStack_3c * 3 + 1] == ':')) goto LAB_001c0496;
      }
      _auStack_3c = 0;
      while( true ) {
        if (0xe < _auStack_3c) {
          for (_auStack_3c = 0; _auStack_3c < 0x2f; _auStack_3c = _auStack_3c + 1) {
            iVar9 = tolower((int)s[_auStack_3c]);
            key[_auStack_3c] = (char)iVar9;
          }
          key[0x2f] = '\0';
          return true;
        }
        if (s[_auStack_3c * 3 + 2] != ':') break;
        _auStack_3c = _auStack_3c + 1;
      }
    }
LAB_001c0496:
    while (s = pcVar7, stack0xffffffffffffffc8 = pcVar13, *s != '\0') {
      if ((*s != '\n') && (*s != '\r')) {
        *stack0xffffffffffffffc8 = *s;
        unique0x1000031a = stack0xffffffffffffffc8 + 1;
      }
      pcVar13 = stack0xffffffffffffffc8;
      pcVar7 = s + 1;
    }
    *stack0xffffffffffffffc8 = '\0';
    sVar12 = strlen(__s);
    if (((((sVar12 & 3) == 0) && (sVar12 = strlen(__s), 8 < sVar12)) &&
        (sVar12 = strspn(__s,"0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ+/="),
        __s[sVar12] == '\0')) &&
       (((iVar9 = base64_decode_atom(__s,(uchar *)((long)&minlen + 2)), 2 < iVar9 &&
         (iVar10 = base64_decode_atom(__s + 4,(uchar *)((long)&minlen + (long)iVar9 + 2)),
         3 < iVar10 + iVar9)) &&
        ((uVar11 = GET_32BIT_MSB_FIRST((void *)((long)&minlen + 2)), uVar11 < 0x41 &&
         (sVar12 = strlen(__s), (ulong)(long)(int)((uVar11 + 6) / 3) <= sVar12)))))) {
      sVar12 = strspn(__s,"0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ+/=");
      memmove(key,__s,sVar12);
      key[sVar12] = '\0';
      return true;
    }
  } while( true );
}

Assistant:

bool validate_manual_hostkey(char *key)
{
    char *p, *q, *r, *s;

    /*
     * Step through the string word by word, looking for a word that's
     * in one of the formats we like.
     */
    p = key;
    while ((p += strspn(p, " \t"))[0]) {
        q = p;
        p += strcspn(p, " \t");
        if (*p) *p++ = '\0';

        /*
         * Now q is our word.
         */

        if (strstartswith(q, "SHA256:")) {
            /* Test for a valid SHA256 key fingerprint. */
            r = q + 7;
            if (strspn(r, BASE64_CHARS_NOEQ) == 43) {
                memmove(key, q, 50); /* 7-char prefix + 43-char base64 */
                key[50] = '\0';
                return true;
            }
        }

        r = q;
        if (strstartswith(r, "MD5:"))
            r += 4;
        if (strlen(r) == 16*3 - 1 &&
            r[strspn(r, "0123456789abcdefABCDEF:")] == 0) {
            /*
             * Test for a valid MD5 key fingerprint. Check the colons
             * are in the right places, and if so, return the same
             * fingerprint canonicalised into lowercase.
             */
            int i;
            for (i = 0; i < 16; i++)
                if (r[3*i] == ':' || r[3*i+1] == ':')
                    goto not_fingerprint; /* sorry */
            for (i = 0; i < 15; i++)
                if (r[3*i+2] != ':')
                    goto not_fingerprint; /* sorry */
            for (i = 0; i < 16*3 - 1; i++)
                key[i] = tolower(r[i]);
            key[16*3 - 1] = '\0';
            return true;
        }
      not_fingerprint:;

        /*
         * Before we check for a public-key blob, trim newlines out of
         * the middle of the word, in case someone's managed to paste
         * in a public-key blob _with_ them.
         */
        for (r = s = q; *r; r++)
            if (*r != '\n' && *r != '\r')
                *s++ = *r;
        *s = '\0';

        if (strlen(q) % 4 == 0 && strlen(q) > 2*4 &&
            q[strspn(q, BASE64_CHARS_ALL)] == 0) {
            /*
             * Might be a base64-encoded SSH-2 public key blob. Check
             * that it starts with a sensible algorithm string. No
             * canonicalisation is necessary for this string type.
             *
             * The algorithm string must be at most 64 characters long
             * (RFC 4251 section 6).
             */
            unsigned char decoded[6];
            unsigned alglen;
            int minlen;
            int len = 0;

            len += base64_decode_atom(q, decoded+len);
            if (len < 3)
                goto not_ssh2_blob;    /* sorry */
            len += base64_decode_atom(q+4, decoded+len);
            if (len < 4)
                goto not_ssh2_blob;    /* sorry */

            alglen = GET_32BIT_MSB_FIRST(decoded);
            if (alglen > 64)
                goto not_ssh2_blob;    /* sorry */

            minlen = ((alglen + 4) + 2) / 3;
            if (strlen(q) < minlen)
                goto not_ssh2_blob;    /* sorry */

            size_t base64_len = strspn(q, BASE64_CHARS_ALL);
            memmove(key, q, base64_len);
            key[base64_len] = '\0';
            return true;
        }
      not_ssh2_blob:;
    }

    return false;
}